

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O0

void la_miam_core_v1_ack_format_json(la_vstring *vstr,void *data)

{
  la_vstring *in_RSI;
  la_miam_core_v1_ack_pdu *pdu;
  la_vstring *vstr_00;
  
  if ((in_RSI->len & 0xffff) == 0) {
    vstr_00 = in_RSI;
    la_json_append_int64(in_RSI,(char *)in_RSI,0x17eb41);
    la_json_append_string(vstr,(char *)data,(char *)pdu);
    la_json_append_int64(vstr_00,(char *)in_RSI,0x17eb75);
    la_json_append_int64(vstr_00,(char *)in_RSI,0x17eb90);
  }
  else {
    la_miam_errors_format_json(in_RSI,(uint32_t)((ulong)in_RSI >> 0x20));
  }
  return;
}

Assistant:

static void la_miam_core_v1_ack_format_json(la_vstring *vstr, void const *data) {
	la_assert(vstr != NULL);
	la_assert(data != NULL);

	la_miam_core_v1_ack_pdu const *pdu = data;
	if(pdu->err & LA_MIAM_ERR_HDR) {
		la_miam_errors_format_json(vstr, pdu->err & LA_MIAM_ERR_HDR);
		return;
	}
	la_json_append_int64(vstr, "pdu_len", pdu->pdu_len);
	la_json_append_string(vstr, "aircraft_id", pdu->aircraft_id);
	la_json_append_int64(vstr, "msg_ack_num", pdu->msg_ack_num);
	la_json_append_int64(vstr, "ack_xfer_result", pdu->ack_xfer_result);
}